

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  ImGuiTableSortSpecsColumn IVar1;
  int iVar2;
  ImGuiTableSortSpecsColumn *pIVar3;
  ImGuiTableColumn *pIVar4;
  ImGuiTableSortSpecsColumn *__dest;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  
  if (table->IsSortSpecsDirty == false) {
    __assert_fail("table->IsSortSpecsDirty",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x2b2a,"void ImGui::TableSortSpecsBuild(ImGuiTable *)");
  }
  TableSortSpecsSanitize(table);
  iVar7 = (int)table->SortSpecsCount;
  iVar2 = (table->SortSpecsData).Capacity;
  if (iVar2 < iVar7) {
    if (iVar2 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar2 / 2 + iVar2;
    }
    if (iVar10 <= iVar7) {
      iVar10 = iVar7;
    }
    if (iVar2 < iVar10) {
      __dest = (ImGuiTableSortSpecsColumn *)MemAlloc((long)iVar10 << 3);
      pIVar3 = (table->SortSpecsData).Data;
      if (pIVar3 != (ImGuiTableSortSpecsColumn *)0x0) {
        memcpy(__dest,pIVar3,(long)(table->SortSpecsData).Size << 3);
        MemFree((table->SortSpecsData).Data);
      }
      (table->SortSpecsData).Data = __dest;
      (table->SortSpecsData).Capacity = iVar10;
    }
  }
  (table->SortSpecsData).Size = iVar7;
  if (0 < table->ColumnsCount) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pIVar4 = (table->Columns).Data;
      if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&(pIVar4->ClipRect).Min.x + lVar5))
      {
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_internal.h"
                      ,0x217,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
      }
      IVar1 = *(ImGuiTableSortSpecsColumn *)(&pIVar4->SortOrder + lVar5);
      uVar8 = (uint)(char)IVar1;
      if (uVar8 != 0xffffffff) {
        if (((char)IVar1 < '\0') || ((table->SortSpecsData).Size <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.h"
                        ,0x688,
                        "T &ImVector<ImGuiTableSortSpecsColumn>::operator[](int) [T = ImGuiTableSortSpecsColumn]"
                       );
        }
        pIVar3 = (table->SortSpecsData).Data;
        uVar9 = (ulong)uVar8;
        *(undefined4 *)(pIVar3 + uVar9 * 8) = *(undefined4 *)((long)&pIVar4->UserID + lVar5);
        pIVar3[uVar9 * 8 + 4] = SUB81(lVar6,0);
        pIVar3[uVar9 * 8 + 5] = IVar1;
        pIVar3[uVar9 * 8 + 6] = *(ImGuiTableSortSpecsColumn *)(&pIVar4->SortDirection + lVar5);
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x68;
    } while (lVar6 < table->ColumnsCount);
  }
  (table->SortSpecs).Specs = (table->SortSpecsData).Data;
  (table->SortSpecs).SpecsCount = (table->SortSpecsData).Size;
  (table->SortSpecs).SpecsDirty = true;
  table->IsSortSpecsDirty = false;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    IM_ASSERT(table->IsSortSpecsDirty);
    TableSortSpecsSanitize(table);

    // Write output
    table->SortSpecsData.resize(table->SortSpecsCount);
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder == -1)
            continue;
        ImGuiTableSortSpecsColumn* sort_spec = &table->SortSpecsData[column->SortOrder];
        sort_spec->ColumnUserID = column->UserID;
        sort_spec->ColumnIndex = (ImU8)column_n;
        sort_spec->SortOrder = (ImU8)column->SortOrder;
        sort_spec->SortDirection = column->SortDirection;
    }
    table->SortSpecs.Specs = table->SortSpecsData.Data;
    table->SortSpecs.SpecsCount = table->SortSpecsData.Size;
    table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
    table->IsSortSpecsDirty = false; // Mark as not dirty for us
}